

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O2

void If_CutFoundFanins_rec(If_Obj_t *pObj,Vec_Int_t *vLeaves)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  for (; (pObj->nRefs == 0 &&
         (((undefined1  [112])*pObj & (undefined1  [112])0xf) != (undefined1  [112])0x2));
      pObj = pObj->pFanin1) {
    If_CutFoundFanins_rec(pObj->pFanin0,vLeaves);
  }
  iVar1 = pObj->Id;
  uVar4 = vLeaves->nSize;
  uVar5 = 0;
  uVar2 = 0;
  if (0 < (int)uVar4) {
    uVar5 = (ulong)uVar4;
  }
  while (uVar5 != uVar2) {
    piVar3 = vLeaves->pArray + uVar2;
    uVar2 = uVar2 + 1;
    if (*piVar3 == iVar1) {
      return;
    }
  }
  if (uVar4 == vLeaves->nCap) {
    uVar6 = 0x10;
    if (0xf < (int)uVar4) {
      uVar6 = uVar4 * 2;
    }
    piVar3 = vLeaves->pArray;
    if ((int)uVar4 < (int)uVar6) {
      if (piVar3 == (int *)0x0) {
        piVar3 = (int *)malloc((ulong)uVar6 << 2);
      }
      else {
        piVar3 = (int *)realloc(piVar3,(ulong)uVar6 << 2);
      }
      vLeaves->pArray = piVar3;
      if (piVar3 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      vLeaves->nCap = uVar6;
      uVar4 = vLeaves->nSize;
    }
  }
  else {
    piVar3 = vLeaves->pArray;
  }
  vLeaves->nSize = uVar4 + 1;
  piVar3[(int)uVar4] = iVar1;
  return;
}

Assistant:

void If_CutFoundFanins_rec( If_Obj_t * pObj, Vec_Int_t * vLeaves )
{
    if ( pObj->nRefs || If_ObjIsCi(pObj) )
    {
        Vec_IntPushUnique( vLeaves, pObj->Id );
        return;
    }
    If_CutFoundFanins_rec( If_ObjFanin0(pObj), vLeaves );
    If_CutFoundFanins_rec( If_ObjFanin1(pObj), vLeaves );
}